

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPF.cpp
# Opt level: O0

SlabThermodynamics * __thiscall
OpenMD::RNEMD::SPFMethod::calculateSlabTherodynamicQuantities
          (SPFMethod *this,SelectionManager *sman)

{
  uint i_00;
  uint i_01;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  RealType RVar6;
  bool bVar7;
  int iVar8;
  double *pdVar9;
  SlabThermodynamics *in_RDI;
  double dVar10;
  int k;
  int j;
  int i;
  Mat3x3d I;
  Vector3d angMom;
  Vector3d vel;
  RealType mass;
  StuntDouble *sd;
  int selej;
  int selei;
  SlabThermodynamics *slab;
  Vector<double,_3U> *in_stack_fffffffffffffe28;
  StuntDouble *in_stack_fffffffffffffe30;
  StuntDouble *in_stack_fffffffffffffe38;
  SelectionManager *in_stack_fffffffffffffe40;
  RectMatrix<double,_3U,_3U> local_c0;
  Vector<double,_3U> local_78 [3];
  RealType local_30;
  StuntDouble *local_28;
  undefined4 local_20;
  undefined4 local_1c;
  
  Vector3<double>::Vector3
            ((Vector3<double> *)in_stack_fffffffffffffe30,
             (Vector3<double> *)in_stack_fffffffffffffe28);
  in_RDI->M = 0.0;
  in_RDI->K = 0.0;
  local_1c = 0;
  local_20 = 0;
  local_28 = SelectionManager::beginSelected
                       (in_stack_fffffffffffffe40,(int *)in_stack_fffffffffffffe38);
  while (local_28 != (StuntDouble *)0x0) {
    local_30 = StuntDouble::getMass(local_28);
    StuntDouble::getVel(in_stack_fffffffffffffe38);
    OpenMD::operator*((double)in_stack_fffffffffffffe38,
                      (Vector<double,_3U> *)in_stack_fffffffffffffe30);
    Vector<double,_3U>::operator+=
              ((Vector<double,_3U> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    RVar6 = local_30;
    in_RDI->M = local_30 + in_RDI->M;
    dVar10 = Vector<double,_3U>::lengthSquare((Vector<double,_3U> *)0x3565b0);
    in_RDI->K = RVar6 * dVar10 + in_RDI->K;
    bVar7 = StuntDouble::isDirectional(in_stack_fffffffffffffe30);
    if (bVar7) {
      StuntDouble::getJ(in_stack_fffffffffffffe38);
      (*local_28->_vptr_StuntDouble[5])(&local_c0);
      bVar7 = StuntDouble::isLinear(local_28);
      if (bVar7) {
        iVar8 = StuntDouble::linearAxis(local_28);
        i_00 = iVar8 + 1 + ((iVar8 + 1) / 3) * -3;
        i_01 = iVar8 + 2 + ((iVar8 + 2) / 3) * -3;
        pdVar9 = Vector<double,_3U>::operator[](local_78,i_00);
        dVar10 = *pdVar9;
        pdVar9 = Vector<double,_3U>::operator[](local_78,i_00);
        dVar1 = *pdVar9;
        pdVar9 = RectMatrix<double,_3U,_3U>::operator()(&local_c0,i_00,i_00);
        dVar2 = *pdVar9;
        pdVar9 = Vector<double,_3U>::operator[](local_78,i_01);
        dVar3 = *pdVar9;
        pdVar9 = Vector<double,_3U>::operator[](local_78,i_01);
        dVar4 = *pdVar9;
        pdVar9 = RectMatrix<double,_3U,_3U>::operator()(&local_c0,i_01,i_01);
        in_RDI->K = (dVar10 * dVar1) / dVar2 + (dVar3 * dVar4) / *pdVar9 + in_RDI->K;
      }
      else {
        pdVar9 = Vector<double,_3U>::operator[](local_78,0);
        dVar10 = *pdVar9;
        pdVar9 = Vector<double,_3U>::operator[](local_78,0);
        dVar1 = *pdVar9;
        pdVar9 = RectMatrix<double,_3U,_3U>::operator()(&local_c0,0,0);
        dVar2 = *pdVar9;
        pdVar9 = Vector<double,_3U>::operator[](local_78,1);
        dVar3 = *pdVar9;
        pdVar9 = Vector<double,_3U>::operator[](local_78,1);
        dVar4 = *pdVar9;
        pdVar9 = RectMatrix<double,_3U,_3U>::operator()(&local_c0,1,1);
        dVar5 = *pdVar9;
        pdVar9 = Vector<double,_3U>::operator[](local_78,2);
        in_stack_fffffffffffffe38 = (StuntDouble *)*pdVar9;
        in_stack_fffffffffffffe40 = (SelectionManager *)Vector<double,_3U>::operator[](local_78,2);
        in_stack_fffffffffffffe28 =
             (Vector<double,_3U> *)
             ((double)in_stack_fffffffffffffe38 * (double)in_stack_fffffffffffffe40->info_);
        in_stack_fffffffffffffe30 =
             (StuntDouble *)RectMatrix<double,_3U,_3U>::operator()(&local_c0,2,2);
        in_RDI->K = (dVar10 * dVar1) / dVar2 + (dVar3 * dVar4) / dVar5 +
                    (double)in_stack_fffffffffffffe28 /
                    ((Vector<double,_3U> *)&in_stack_fffffffffffffe30->_vptr_StuntDouble)->data_[0]
                    + in_RDI->K;
      }
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x356a4a);
    }
    local_28 = SelectionManager::nextSelected
                         (in_stack_fffffffffffffe40,(int *)in_stack_fffffffffffffe38);
  }
  in_RDI->K = in_RDI->K * 0.5;
  return in_RDI;
}

Assistant:

SPFMethod::SlabThermodynamics SPFMethod::calculateSlabTherodynamicQuantities(
      SelectionManager& sman) {
    SlabThermodynamics slab {};

    int selei {}, selej {};

    StuntDouble* sd;

    for (sd = sman.beginSelected(selei); sd != NULL;
         sd = sman.nextSelected(selei)) {
      RealType mass = sd->getMass();
      Vector3d vel  = sd->getVel();

      slab.P += mass * vel;
      slab.M += mass;
      slab.K += mass * vel.lengthSquare();

      if (sd->isDirectional()) {
        Vector3d angMom = sd->getJ();
        Mat3x3d I       = sd->getI();
        if (sd->isLinear()) {
          int i = sd->linearAxis();
          int j = (i + 1) % 3;
          int k = (i + 2) % 3;
          slab.K +=
              angMom[j] * angMom[j] / I(j, j) + angMom[k] * angMom[k] / I(k, k);
        } else {
          slab.K += angMom[0] * angMom[0] / I(0, 0) +
                    angMom[1] * angMom[1] / I(1, 1) +
                    angMom[2] * angMom[2] / I(2, 2);
        }
      }
    }

    slab.K *= 0.5;

#ifdef IS_MPI
    MPI_Allreduce(MPI_IN_PLACE, &(slab.P[0]), 3, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &(slab.M), 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &(slab.K), 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
#endif

    return slab;
  }